

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O3

int compute_all_sbbb(uint8_t dst,uint8_t src2,uint8_t src3)

{
  bool bVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  undefined7 in_register_00000039;
  
  bVar2 = src2 + dst + src3;
  bVar1 = bVar2 <= src2;
  if ((int)CONCAT71(in_register_00000011,src3) == 0) {
    bVar1 = bVar2 < src2;
  }
  uVar3 = (uint)CONCAT71(in_register_00000039,dst);
  return (uint)(byte)((bVar2 ^ dst ^ src2) & 0x10 | bVar1 |
                     "\x04"[CONCAT71(in_register_00000039,dst) & 0xffffffff]) |
         ((byte)((bVar2 ^ src2) & (bVar2 ^ dst)) & 0x80) << 4 |
         (uint)(uVar3 == 0) << 6 | uVar3 & 0xffffff80;
}

Assistant:

static int glue(compute_all_sbb, SUFFIX)(DATA_TYPE dst, DATA_TYPE src2,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src1 = dst + src2 + src3;

    cf = (src3 ? src1 <= src2 : src1 < src2);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}